

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hqnx_32_common.h
# Opt level: O2

uint32_t Interpolate_2(uint32_t c1,int w1,uint32_t c2,int w2,int s)

{
  byte bVar1;
  
  if (c1 != c2) {
    bVar1 = (byte)s;
    c1 = (c2 & 0xff00ff) * w2 + (c1 & 0xff00ff) * w1 >> (bVar1 & 0x1f) & 0xff00ff |
         (c2 & 0xff00) * w2 + (c1 & 0xff00) * w1 >> (bVar1 & 0x1f) & 0xff00 |
         (c2 >> 0x18) * w2 + (c1 >> 0x18) * w1 << (0x18 - bVar1 & 0x1f) & 0xff000000;
  }
  return c1;
}

Assistant:

static inline uint32_t Interpolate_2(uint32_t c1, int w1, uint32_t c2, int w2, int s)
{
    if (c1 == c2) {
        return c1;
    }
    return
        (((((c1 & MASK_ALPHA) >> 24) * w1 + ((c2 & MASK_ALPHA) >> 24) * w2) << (24-s)) & MASK_ALPHA) +
        ((((c1 & MASK_2) * w1 + (c2 & MASK_2) * w2) >> s) & MASK_2)	+
        ((((c1 & MASK_13) * w1 + (c2 & MASK_13) * w2) >> s) & MASK_13);
}